

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * CreateUpvalueClose(ExpressionContext *ctx,SynBase *source,VariableData *variable)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  int iVar3;
  uint uVar4;
  ExprBase *pEVar5;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  TypeRef *pTVar7;
  undefined4 extraout_var_00;
  ExprBase *arg3;
  InplaceStr name;
  ExprBase *arg1;
  undefined4 extraout_var_01;
  
  pEVar5 = GetFunctionUpvalue(ctx,source,variable);
  pEVar5 = CreateGetAddress(ctx,source,pEVar5);
  pEVar6 = CreateVariableAccess(ctx,source,variable,false);
  pEVar6 = CreateGetAddress(ctx,source,pEVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  arg1 = (ExprBase *)CONCAT44(extraout_var,iVar3);
  pTVar7 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  arg1->typeID = 0x12;
  arg1->source = source;
  arg1->type = &pTVar7->super_TypeBase;
  arg1->next = (ExprBase *)0x0;
  arg1->listed = false;
  arg1->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002409d8;
  arg1[1]._vptr_ExprBase = (_func_int **)pEVar6;
  arg1[1].typeID = 0xd;
  uVar4 = GetAlignmentOffset(0x10,variable->type->alignment);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar1 = ctx->typeInt;
  pEVar6->typeID = 6;
  pEVar6->source = source;
  pEVar6->type = pTVar1;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
  pEVar6[1]._vptr_ExprBase = (_func_int **)(ulong)(uVar4 + 0x10);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  arg3 = (ExprBase *)CONCAT44(extraout_var_01,iVar3);
  pTVar1 = ctx->typeInt;
  pp_Var2 = (_func_int **)variable->type->size;
  arg3->typeID = 6;
  arg3->source = source;
  arg3->type = pTVar1;
  arg3->next = (ExprBase *)0x0;
  arg3->listed = false;
  arg3->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
  arg3[1]._vptr_ExprBase = pp_Var2;
  name.end = "";
  name.begin = "__closeUpvalue";
  pEVar5 = CreateFunctionCall4(ctx,source,name,pEVar5,arg1,pEVar6,arg3,false,true,true);
  return pEVar5;
}

Assistant:

ExprBase* CreateUpvalueClose(ExpressionContext &ctx, SynBase *source, VariableData *variable)
{
	ExprBase *upvalueAddress = CreateGetAddress(ctx, source, GetFunctionUpvalue(ctx, source, variable));

	ExprBase *variableAddress = CreateGetAddress(ctx, source, CreateVariableAccess(ctx, source, variable, false));

	variableAddress = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(ctx.typeVoid), variableAddress, EXPR_CAST_REINTERPRET);

	// Two pointers before data
	unsigned offset = NULLC_PTR_SIZE + NULLC_PTR_SIZE;

	offset += GetAlignmentOffset(offset, variable->type->alignment);

	ExprBase *copyOffset = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, offset);

	ExprBase *copySize = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, variable->type->size);

	return CreateFunctionCall4(ctx, source, InplaceStr("__closeUpvalue"), upvalueAddress, variableAddress, copyOffset, copySize, false, true, true);
}